

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_1U>::getUNORM
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_1U> *this,uint32_t numChannels,uint32_t targetBits,uint32_t sBits)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  allocator_type local_39;
  uint local_38;
  uint local_34;
  
  if (1 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x325,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  if ((0x20 < targetBits) || ((0x100010100U >> ((ulong)targetBits & 0x3f) & 1) == 0)) {
    __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x326,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  local_38 = ~(-1 << ((byte)sBits & 0x1f)) << ((char)targetBits - (byte)sBits & 0x1f);
  uVar10 = targetBits >> 3;
  uVar11 = 0;
  local_34 = -(uint)(sBits == 0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar10 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_39);
  auVar3 = _DAT_0017e500;
  auVar2 = _DAT_0017e4f0;
  uVar7 = (this->super_Image).height;
  if (uVar7 != 0) {
    local_34 = local_34 | local_38;
    uVar4 = 8;
    if (8 < targetBits) {
      uVar4 = (ulong)targetBits;
    }
    uVar5 = (this->super_Image).width;
    uVar4 = uVar4 - 1;
    auVar18._8_4_ = (int)uVar4;
    auVar18._0_8_ = uVar4;
    auVar18._12_4_ = (int)(uVar4 >> 0x20);
    auVar12._0_8_ = uVar4 >> 3;
    auVar12._8_8_ = auVar18._8_8_ >> 3;
    auVar12 = auVar12 ^ _DAT_0017e500;
    uVar8 = uVar5;
    do {
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        uVar7 = 0;
        do {
          if (numChannels == 1) {
            uVar5 = uVar5 * uVar11 + uVar7;
            uVar8 = (uint)this->pixels[uVar5].field_0.comps[0];
            if (targetBits == 8) {
              puVar6 = (uint *)((__return_storage_ptr__->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start + uVar5 * uVar10);
LAB_00122a73:
              *(byte *)puVar6 = (byte)uVar8 & (byte)local_34;
            }
            else {
              lVar9 = 2;
              auVar13 = ZEXT816(0);
              iVar16 = 0;
              do {
                auVar18 = auVar13;
                auVar13._0_8_ = ((ulong)uVar8 << (ulong)(targetBits - iVar16)) >> 8;
                auVar13._8_8_ = 0;
                auVar13 = auVar13 | auVar18;
                iVar16 = iVar16 + 0x10;
                lVar1 = ((uVar4 >> 3) + 2 & 0xfffffffffffffffe) + lVar9;
                lVar9 = lVar9 + -2;
              } while (lVar1 != 4);
              lVar9 = -lVar9;
              auVar14._8_4_ = (int)lVar9;
              auVar14._0_8_ = lVar9;
              auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
              auVar14 = (auVar14 | auVar2) ^ auVar3;
              iVar16 = -(uint)(auVar12._0_4_ < auVar14._0_4_);
              auVar17._4_4_ = -(uint)(auVar12._4_4_ < auVar14._4_4_);
              iVar19 = -(uint)(auVar12._8_4_ < auVar14._8_4_);
              auVar17._12_4_ = -(uint)(auVar12._12_4_ < auVar14._12_4_);
              auVar20._4_4_ = iVar16;
              auVar20._0_4_ = iVar16;
              auVar20._8_4_ = iVar19;
              auVar20._12_4_ = iVar19;
              auVar15._4_4_ = -(uint)(auVar14._4_4_ == auVar12._4_4_);
              auVar15._12_4_ = -(uint)(auVar14._12_4_ == auVar12._12_4_);
              auVar15._0_4_ = auVar15._4_4_;
              auVar15._8_4_ = auVar15._12_4_;
              auVar17._0_4_ = auVar17._4_4_;
              auVar17._8_4_ = auVar17._12_4_;
              auVar17 = auVar17 | auVar15 & auVar20;
              auVar18 = ~auVar17 & auVar13 | auVar18 & auVar17;
              uVar8 = auVar18._8_4_ | auVar18._0_4_;
              puVar6 = (uint *)((__return_storage_ptr__->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start + uVar5 * uVar10);
              if (targetBits == 0x20) {
                *puVar6 = uVar8 & local_34;
              }
              else if (targetBits == 0x10) {
                *(ushort *)puVar6 = (ushort)uVar8 & (ushort)local_34;
              }
              else if (targetBits == 8) goto LAB_00122a73;
            }
            uVar5 = (this->super_Image).width;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar5);
        uVar7 = (this->super_Image).height;
        uVar8 = uVar5;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> getUNORM(uint32_t numChannels, uint32_t targetBits, uint32_t sBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32);

        const uint32_t sourceBits = sizeof(componentType) * 8;
        const uint32_t targetBytes = targetBits / 8;
        const uint32_t mask = (sBits == 0) ? 0xFFFFFFFF : ((1u << sBits) - 1u) << (targetBits - sBits);
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto sourceValue = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : Color::one());
                    const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, targetBits);
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    }
                }
            }
        }

        return data;
    }